

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O0

void add_timespec(timespec *ts,int64 addtime)

{
  long lVar1;
  int64 nsec;
  int64 sec;
  int64 addtime_local;
  timespec *ts_local;
  
  ts->tv_sec = (addtime - addtime % 1000000000) / 1000000000 + ts->tv_sec;
  ts->tv_nsec = addtime % 1000000000 + ts->tv_nsec;
  if (1000000000 < ts->tv_nsec) {
    lVar1 = ts->tv_nsec % 1000000000;
    ts->tv_sec = (ts->tv_nsec - lVar1) / 1000000000 + ts->tv_sec;
    ts->tv_nsec = lVar1;
  }
  return;
}

Assistant:

void add_timespec(struct timespec *ts, int64 addtime)
{
   int64 sec, nsec;
   
   nsec = addtime % NSEC_PER_SEC;
   sec = (addtime - nsec) / NSEC_PER_SEC;
   ts->tv_sec += sec;
   ts->tv_nsec += nsec;
   if ( ts->tv_nsec > NSEC_PER_SEC ) 
   { 
      nsec = ts->tv_nsec % NSEC_PER_SEC;
      ts->tv_sec += (ts->tv_nsec - nsec) / NSEC_PER_SEC;
      ts->tv_nsec = nsec;
   }   
}